

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O2

bool __thiscall woff2::Buffer::Read(Buffer *this,uint8_t *data,size_t n_bytes)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  
  if (0x40000000 < n_bytes) {
    return false;
  }
  uVar1 = this->offset_;
  uVar3 = uVar1 + n_bytes;
  if (this->length_ - n_bytes < uVar1 || this->length_ < uVar3) {
    bVar2 = false;
  }
  else {
    if (data != (uint8_t *)0x0) {
      memcpy(data,this->buffer_ + uVar1,n_bytes);
      uVar3 = n_bytes + this->offset_;
    }
    this->offset_ = uVar3;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Read(uint8_t *data, size_t n_bytes) {
    if (n_bytes > 1024 * 1024 * 1024) {
      return FONT_COMPRESSION_FAILURE();
    }
    if ((offset_ + n_bytes > length_) ||
        (offset_ > length_ - n_bytes)) {
      return FONT_COMPRESSION_FAILURE();
    }
    if (data) {
      std::memcpy(data, buffer_ + offset_, n_bytes);
    }
    offset_ += n_bytes;
    return true;
  }